

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

bool CivetServer::getParam(char *data,size_t data_len,char *name,string *dst,size_t occurrence)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  value_type *__val;
  char buf [256];
  vector<char,_std::allocator<char>_> local_150;
  char local_138 [264];
  
  iVar4 = mg_get_var2(data,data_len,name,local_138,0x100,occurrence);
  if (iVar4 < 0) {
    if (iVar4 == -2) {
      local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x200);
      pcVar1 = local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x200;
      local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar1;
      memset(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x200);
      local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar1;
      while (uVar5 = mg_get_var2(data,data_len,name,
                                 local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 (long)local_150.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_150.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start,occurrence),
            (int)uVar5 < 0) {
        if (uVar5 != 0xfffffffe) goto LAB_00118a48;
        std::vector<char,_std::allocator<char>_>::resize
                  (&local_150,
                   ((long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) * 2);
      }
      pcVar2 = (dst->_M_dataplus)._M_p;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)dst,pcVar2,pcVar2 + dst->_M_string_length,
                 local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5);
LAB_00118a48:
      if (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (-1 < (int)uVar5) {
        return true;
      }
    }
    dst->_M_string_length = 0;
    *(dst->_M_dataplus)._M_p = '\0';
    bVar3 = false;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)dst,0,(char *)dst->_M_string_length,(ulong)local_138);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
CivetServer::getParam(const char *data,
                      size_t data_len,
                      const char *name,
                      std::string &dst,
                      size_t occurrence)
{
	char buf[256];
	int r = mg_get_var2(data, data_len, name, buf, sizeof(buf), occurrence);
	if (r >= 0) {
		// dst can contain NUL characters
		dst.assign(buf, r);
		return true;
	} else if (r == -2) {
		// more buffer
		std::vector<char> vbuf(sizeof(buf) * 2);
		for (;;) {
			r = mg_get_var2(
			    data, data_len, name, &vbuf[0], vbuf.size(), occurrence);
			if (r >= 0) {
				dst.assign(vbuf.begin(), vbuf.begin() + r);
				return true;
			} else if (r != -2) {
				break;
			}
			// more buffer
			vbuf.resize(vbuf.size() * 2);
		}
	}
	dst.clear();
	return false;
}